

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.cpp
# Opt level: O3

void __thiscall Chromosome::walkPath(Chromosome *this)

{
  pointer *pppVar1;
  int iVar2;
  int iVar3;
  pointer ppVar4;
  undefined8 uVar5;
  iterator __position;
  int iVar6;
  undefined8 *puVar7;
  pointer pCVar8;
  size_type sVar9;
  size_type extraout_RDX;
  pointer pCVar10;
  ulong uVar11;
  int iVar12;
  char *pcVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  pair<Coordinate,_Coordinate> local_58;
  vector<std::pair<Coordinate,Coordinate>,std::allocator<std::pair<Coordinate,Coordinate>>>
  *local_40;
  long local_38;
  
  this->collisions = 0;
  ppVar4 = (this->pairs).
           super__Vector_base<std::pair<Coordinate,_Coordinate>,_std::allocator<std::pair<Coordinate,_Coordinate>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->pairs).
      super__Vector_base<std::pair<Coordinate,_Coordinate>,_std::allocator<std::pair<Coordinate,_Coordinate>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar4) {
    (this->pairs).
    super__Vector_base<std::pair<Coordinate,_Coordinate>,_std::allocator<std::pair<Coordinate,_Coordinate>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar4;
  }
  pCVar8 = (this->pathList).super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar10 = (this->pathList).super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pCVar10 != pCVar8) {
    local_40 = (vector<std::pair<Coordinate,Coordinate>,std::allocator<std::pair<Coordinate,Coordinate>>>
                *)&this->pairs;
    local_38 = 0x18;
    uVar17 = 0;
    do {
      uVar16 = uVar17 + 2;
      sVar9 = ((long)pCVar10 - (long)pCVar8 >> 2) * -0x5555555555555555;
      if (uVar16 < sVar9) {
        iVar2 = pCVar8[uVar17].x;
        iVar3 = pCVar8[uVar17].y;
        lVar15 = local_38;
        do {
          iVar14 = *(int *)((long)&pCVar8->x + lVar15);
          iVar12 = *(int *)((long)&pCVar8->y + lVar15);
          if ((iVar2 == iVar14) && (iVar3 == iVar12)) {
            this->collisions = this->collisions + 1;
          }
          uVar11 = uVar17;
          if (GeneticAlgorithm::params.sequence._M_string_length <= uVar17) {
LAB_0010a904:
            pcVar13 = "basic_string::at: __n (which is %zu) >= this->size() (which is %zu)";
            sVar9 = GeneticAlgorithm::params.sequence._M_string_length;
            goto LAB_0010a907;
          }
          if (GeneticAlgorithm::params.sequence._M_dataplus._M_p[uVar17] == '1') {
            uVar11 = uVar16;
            if (GeneticAlgorithm::params.sequence._M_string_length <= uVar16) goto LAB_0010a904;
            if (GeneticAlgorithm::params.sequence._M_dataplus._M_p[uVar16] != '\0') {
              if (sVar9 <= uVar17) {
                do {
                  pcVar13 = 
                  "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
                  uVar11 = uVar17;
LAB_0010a907:
                  std::__throw_out_of_range_fmt(pcVar13,uVar11,sVar9);
                  sVar9 = extraout_RDX;
                } while( true );
              }
              iVar14 = iVar14 - pCVar8[uVar17].x;
              iVar6 = -iVar14;
              if (0 < iVar14) {
                iVar6 = iVar14;
              }
              iVar12 = iVar12 - pCVar8[uVar17].y;
              iVar14 = -iVar12;
              if (0 < iVar12) {
                iVar14 = iVar12;
              }
              if (iVar14 + iVar6 == 1) {
                pCVar10 = pCVar8 + uVar17;
                puVar7 = (undefined8 *)((long)&pCVar8->x + lVar15);
                local_58.first.facing = pCVar10->facing;
                local_58.first.x = pCVar10->x;
                local_58.first.y = pCVar10->y;
                local_58.second.facing = *(FACING *)(puVar7 + 1);
                uVar5 = *puVar7;
                local_58.second.x = (int)uVar5;
                local_58.second.y = (int)((ulong)uVar5 >> 0x20);
                __position._M_current =
                     (this->pairs).
                     super__Vector_base<std::pair<Coordinate,_Coordinate>,_std::allocator<std::pair<Coordinate,_Coordinate>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (this->pairs).
                    super__Vector_base<std::pair<Coordinate,_Coordinate>,_std::allocator<std::pair<Coordinate,_Coordinate>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<std::pair<Coordinate,Coordinate>,std::allocator<std::pair<Coordinate,Coordinate>>>
                  ::_M_realloc_insert<std::pair<Coordinate,Coordinate>>
                            (local_40,__position,&local_58);
                }
                else {
                  ((__position._M_current)->second).y = local_58.second.y;
                  ((__position._M_current)->second).facing = local_58.second.facing;
                  ((__position._M_current)->first).x = local_58.first.x;
                  ((__position._M_current)->first).y = local_58.first.y;
                  *(ulong *)&((__position._M_current)->first).facing =
                       CONCAT44(local_58.second.x,local_58.first.facing);
                  pppVar1 = &(this->pairs).
                             super__Vector_base<std::pair<Coordinate,_Coordinate>,_std::allocator<std::pair<Coordinate,_Coordinate>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *pppVar1 = *pppVar1 + 1;
                }
                pCVar8 = (this->pathList).
                         super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
                         super__Vector_impl_data._M_start;
                pCVar10 = (this->pathList).
                          super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              }
            }
          }
          uVar16 = uVar16 + 1;
          sVar9 = ((long)pCVar10 - (long)pCVar8 >> 2) * -0x5555555555555555;
          lVar15 = lVar15 + 0xc;
        } while (uVar16 < sVar9);
        sVar9 = ((long)pCVar10 - (long)pCVar8 >> 2) * -0x5555555555555555;
      }
      uVar17 = uVar17 + 1;
      local_38 = local_38 + 0xc;
    } while (uVar17 < sVar9);
  }
  return;
}

Assistant:

void Chromosome::walkPath() {

    // reset collisions counter;
    this->collisions = 0;
    pairs.clear();


    Coordinate cord1;
    Coordinate cord2;

    for (size_t i = 0; i < pathList.size(); i++){
        cord1 =  pathList.at(i);
        for(size_t j = i + 2; j < pathList.size(); j++){
            cord2 = pathList.at(j);
            if(cord1.x == cord2.x && cord1.y == cord2.y) {
                collisions++;
            }
            if(GeneticAlgorithm::params.sequence.at(i) == '1' && GeneticAlgorithm::params.sequence.at(j)){
                if (isPair(pathList.at(i), pathList.at(j))){
                    pairs.push_back(std::make_pair<Coordinate, Coordinate>(
                            (Coordinate &&) pathList.at(i),
                            (Coordinate &&) pathList.at(j))
                    );
                }
            }
        }
    }
}